

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

void duckdb_je_prof_tdata_detach(tsd_t *tsd,prof_tdata_t *tdata)

{
  malloc_mutex_t *pmVar1;
  _Bool _Var2;
  _Bool even_if_attached;
  _Bool even_if_attached_00;
  
  malloc_mutex_lock((tsdn_t *)tsd,tdata->lock);
  if (tdata->attached == true) {
    _Var2 = prof_tdata_should_destroy((tsdn_t *)tdata,(prof_tdata_t *)0x1,even_if_attached);
    if (_Var2) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
      pmVar1 = tdata->lock;
      (pmVar1->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
      prof_tdata_destroy(tsd,tdata,even_if_attached_00);
      return;
    }
    tdata->attached = false;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
  }
  pmVar1 = tdata->lock;
  (pmVar1->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar1->field_0 + 0x48));
  return;
}

Assistant:

void
prof_tdata_detach(tsd_t *tsd, prof_tdata_t *tdata) {
	bool destroy_tdata;

	malloc_mutex_lock(tsd_tsdn(tsd), tdata->lock);
	if (tdata->attached) {
		destroy_tdata = prof_tdata_should_destroy(tsd_tsdn(tsd), tdata,
		    true);
		/*
		 * Only detach if !destroy_tdata, because detaching would allow
		 * another thread to win the race to destroy tdata.
		 */
		if (!destroy_tdata) {
			tdata->attached = false;
		}
		tsd_prof_tdata_set(tsd, NULL);
	} else {
		destroy_tdata = false;
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), tdata->lock);
	if (destroy_tdata) {
		prof_tdata_destroy(tsd, tdata, true);
	}
}